

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O2

QByteArray * __thiscall
QCryptographicHash::result(QByteArray *__return_storage_ptr__,QCryptographicHash *this)

{
  long in_FS_OFFSET;
  QByteArrayView local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = resultView(this);
  QByteArrayView::toByteArray(__return_storage_ptr__,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QCryptographicHash::result() const
{
    return resultView().toByteArray();
}